

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t FSE_normalizeCount(short *normalizedCounter,uint tableLog,uint *count,size_t total,
                         uint maxSymbolValue,uint useLowProbCount)

{
  undefined1 auVar1 [16];
  char cVar2;
  byte bVar3;
  short sVar4;
  uint uVar5;
  byte bVar6;
  uint uVar7;
  short *psVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ushort uVar20;
  
  uVar12 = 0xb;
  if (tableLog != 0) {
    uVar12 = (ulong)tableLog;
  }
  uVar11 = (uint)uVar12;
  uVar19 = 0xffffffffffffffff;
  if ((4 < uVar11) && (uVar19 = 0xffffffffffffffd4, uVar11 < 0xd)) {
    if (total < 2) {
      __assert_fail("srcSize > 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x3913,"unsigned int FSE_minTableLog(size_t, unsigned int)");
    }
    uVar5 = 0x1f;
    if (maxSymbolValue != 0) {
      for (; maxSymbolValue >> uVar5 == 0; uVar5 = uVar5 - 1) {
      }
    }
    uVar7 = 0x1f;
    if ((uint)total != 0) {
      for (; (uint)total >> uVar7 == 0; uVar7 = uVar7 - 1) {
      }
    }
    uVar7 = (uVar7 ^ 0xffffffe0) + 0x21;
    uVar5 = (uVar5 ^ 0xffffffe0) + 0x22;
    if (uVar7 < uVar5) {
      uVar5 = uVar7;
    }
    uVar19 = 0xffffffffffffffff;
    if (uVar5 <= uVar11) {
      uVar20 = -(ushort)(useLowProbCount != 0) | 1;
      bVar3 = (byte)uVar12;
      cVar2 = -bVar3;
      bVar6 = cVar2 + 0x3e;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = total & 0xffffffff;
      uVar9 = 1 << (bVar3 & 0x1f);
      uVar7 = 0;
      uVar11 = 0;
      uVar10 = 0;
      uVar5 = uVar9;
      do {
        uVar19 = (ulong)count[uVar10];
        if (uVar19 == total) {
          return 0;
        }
        uVar13 = (uint)(total >> (bVar3 & 0x3f));
        if (uVar19 == 0) {
          normalizedCounter[uVar10] = 0;
        }
        else if (uVar13 < count[uVar10]) {
          uVar19 = uVar19 * SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x4000000000000000)) / auVar1,0);
          uVar16 = uVar19 >> (bVar6 & 0x3f);
          uVar14 = (uint)uVar16;
          if ((uVar16 & 0xfff8) == 0) {
            uVar14 = uVar14 + ((ulong)FSE_normalizeCount::rtbTable[uVar16 & 0xffff] <<
                               (cVar2 + 0x2aU & 0x3f) <
                              uVar19 - ((uVar16 & 0xffff) << (bVar6 & 0x3f)));
          }
          if ((ushort)uVar7 < (ushort)uVar14) {
            uVar7 = uVar14 & 0xffff;
            uVar11 = uVar10;
          }
          normalizedCounter[uVar10] = (ushort)uVar14;
          uVar5 = uVar5 - (uVar14 & 0xffff);
        }
        else {
          normalizedCounter[uVar10] = uVar20;
          uVar5 = uVar5 - 1;
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 <= maxSymbolValue);
      sVar4 = normalizedCounter[uVar11];
      iVar15 = (int)sVar4 >> 1;
      if (iVar15 == -uVar5 || SBORROW4(iVar15,-uVar5) != (int)(iVar15 + uVar5) < 0) {
        uVar18 = total * 3 >> (bVar3 + 1 & 0x3f);
        uVar16 = (ulong)(maxSymbolValue + 1);
        uVar19 = 0;
        uVar11 = 0;
        do {
          uVar5 = count[uVar19];
          if ((ulong)uVar5 == 0) {
            normalizedCounter[uVar19] = 0;
          }
          else {
            if (uVar13 < uVar5) {
              if ((uint)uVar18 < uVar5) {
                normalizedCounter[uVar19] = -2;
                goto LAB_0013f63b;
              }
              normalizedCounter[uVar19] = 1;
            }
            else {
              normalizedCounter[uVar19] = uVar20;
            }
            uVar11 = uVar11 + 1;
            total = total - uVar5;
          }
LAB_0013f63b:
          uVar19 = uVar19 + 1;
        } while (uVar16 != uVar19);
        uVar5 = uVar9 - uVar11;
        if (uVar5 == 0) {
          return uVar12;
        }
        if ((uVar18 & 0xffffffff) < total / uVar5) {
          uVar19 = total * 3;
          uVar18 = 0;
          do {
            if ((normalizedCounter[uVar18] == -2) &&
               (uVar7 = count[uVar18], uVar7 <= (uint)(uVar19 / (uVar5 * 2)))) {
              normalizedCounter[uVar18] = 1;
              uVar11 = uVar11 + 1;
              total = total - uVar7;
            }
            uVar18 = uVar18 + 1;
          } while (uVar16 != uVar18);
          uVar5 = uVar9 - uVar11;
        }
        if (uVar11 != maxSymbolValue + 1) {
          if (total == 0) {
            if (uVar5 == 0) {
              return uVar12;
            }
            uVar19 = 0;
            do {
              if (0 < normalizedCounter[uVar19]) {
                uVar5 = uVar5 - 1;
                normalizedCounter[uVar19] = normalizedCounter[uVar19] + 1;
              }
              uVar11 = (uint)uVar19;
              uVar19 = (ulong)(uVar11 + 1);
              if (uVar11 == maxSymbolValue) {
                uVar19 = 0;
              }
            } while (uVar5 != 0);
            return uVar12;
          }
          uVar16 = ~(-1L << (cVar2 + 0x3dU & 0x3f));
          uVar11 = 0;
          uVar19 = uVar16;
          do {
            uVar18 = uVar19;
            if (normalizedCounter[uVar11] == -2) {
              uVar18 = (ulong)count[uVar11] *
                       ((((ulong)uVar5 << (bVar6 & 0x3f)) + uVar16) / (total & 0xffffffff)) + uVar19
              ;
              uVar19 = uVar19 >> (bVar6 & 0x3f);
              uVar17 = uVar18 >> (bVar6 & 0x3f);
              if (uVar17 == uVar19) {
                return 0xffffffffffffffff;
              }
              normalizedCounter[uVar11] = (short)uVar17 - (short)uVar19;
            }
            uVar11 = uVar11 + 1;
            uVar19 = uVar18;
          } while (uVar11 <= maxSymbolValue);
          return uVar12;
        }
        uVar18 = 0;
        uVar11 = 0;
        uVar19 = 0;
        do {
          if (uVar11 < count[uVar18]) {
            uVar19 = uVar18 & 0xffffffff;
            uVar11 = count[uVar18];
          }
          uVar18 = uVar18 + 1;
        } while (uVar16 != uVar18);
        psVar8 = normalizedCounter + uVar19;
        sVar4 = *psVar8;
      }
      else {
        psVar8 = normalizedCounter + uVar11;
      }
      *psVar8 = sVar4 + (short)uVar5;
      uVar19 = uVar12;
    }
  }
  return uVar19;
}

Assistant:

size_t FSE_normalizeCount (short* normalizedCounter, unsigned tableLog,
                           const unsigned* count, size_t total,
                           unsigned maxSymbolValue, unsigned useLowProbCount)
{
    /* Sanity checks */
    if (tableLog==0) tableLog = FSE_DEFAULT_TABLELOG;
    if (tableLog < FSE_MIN_TABLELOG) return ERROR(GENERIC);   /* Unsupported size */
    if (tableLog > FSE_MAX_TABLELOG) return ERROR(tableLog_tooLarge);   /* Unsupported size */
    if (tableLog < FSE_minTableLog(total, maxSymbolValue)) return ERROR(GENERIC);   /* Too small tableLog, compression potentially impossible */

    {   static U32 const rtbTable[] = {     0, 473195, 504333, 520860, 550000, 700000, 750000, 830000 };
        short const lowProbCount = useLowProbCount ? -1 : 1;
        U64 const scale = 62 - tableLog;
        U64 const step = ZSTD_div64((U64)1<<62, (U32)total);   /* <== here, one division ! */
        U64 const vStep = 1ULL<<(scale-20);
        int stillToDistribute = 1<<tableLog;
        unsigned s;
        unsigned largest=0;
        short largestP=0;
        U32 lowThreshold = (U32)(total >> tableLog);

        for (s=0; s<=maxSymbolValue; s++) {
            if (count[s] == total) return 0;   /* rle special case */
            if (count[s] == 0) { normalizedCounter[s]=0; continue; }
            if (count[s] <= lowThreshold) {
                normalizedCounter[s] = lowProbCount;
                stillToDistribute--;
            } else {
                short proba = (short)((count[s]*step) >> scale);
                if (proba<8) {
                    U64 restToBeat = vStep * rtbTable[proba];
                    proba += (count[s]*step) - ((U64)proba<<scale) > restToBeat;
                }
                if (proba > largestP) { largestP=proba; largest=s; }
                normalizedCounter[s] = proba;
                stillToDistribute -= proba;
        }   }
        if (-stillToDistribute >= (normalizedCounter[largest] >> 1)) {
            /* corner case, need another normalization method */
            size_t const errorCode = FSE_normalizeM2(normalizedCounter, tableLog, count, total, maxSymbolValue, lowProbCount);
            if (FSE_isError(errorCode)) return errorCode;
        }
        else normalizedCounter[largest] += (short)stillToDistribute;
    }

#if 0
    {   /* Print Table (debug) */
        U32 s;
        U32 nTotal = 0;
        for (s=0; s<=maxSymbolValue; s++)
            RAWLOG(2, "%3i: %4i \n", s, normalizedCounter[s]);
        for (s=0; s<=maxSymbolValue; s++)
            nTotal += abs(normalizedCounter[s]);
        if (nTotal != (1U<<tableLog))
            RAWLOG(2, "Warning !!! Total == %u != %u !!!", nTotal, 1U<<tableLog);
        getchar();
    }
#endif

    return tableLog;
}